

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.h
# Opt level: O3

void __thiscall
booster::thread_specific_ptr<icu_70::NumberFormat>::reset
          (thread_specific_ptr<icu_70::NumberFormat> *this,NumberFormat *new_val)

{
  long *plVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  iVar2 = (*(((this->key_).p_)->super_refcounted)._vptr_refcounted[2])();
  plVar1 = *(long **)(CONCAT44(extraout_var,iVar2) + 8);
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 8))();
  }
  iVar2 = (*(((this->key_).p_)->super_refcounted)._vptr_refcounted[2])();
  *(NumberFormat **)(CONCAT44(extraout_var_00,iVar2) + 8) = new_val;
  return;
}

Assistant:

void reset(T *new_val = 0)
		{
			T *p = get();
			if(p)
				destructor(p);
			key_->set(static_cast<void *>(new_val));
		}